

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O3

RBTree<int> * __thiscall BinTrees::RBTree<int>::i<int_const&>(RBTree<int> *this,int *v)

{
  int iVar1;
  int iVar2;
  BinTree<int> *pBVar3;
  runtime_error *this_00;
  RBTree<int> *pRVar4;
  RBTree<int> *pRVar5;
  RBTree<int> *pRVar6;
  RBTree<int> *pRVar7;
  RBTree<int> *pRVar8;
  RBTree<int> *pRVar9;
  long lVar10;
  
  iVar1 = *v;
  iVar2 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  pRVar7 = this;
  do {
    if (iVar2 == iVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Repeated insert.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar2 < iVar1) {
      pRVar4 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.r;
      if (pRVar4 == (RBTree<int> *)0x0) {
        lVar10 = 0x10;
LAB_00102cae:
        pRVar4 = (RBTree<int> *)operator_new(0x28);
        (pRVar4->super_BinSTree<int>).super_BinTree<int>.v = iVar1;
        (pRVar4->super_BinSTree<int>).super_BinTree<int>.l = (BinTree<int> *)0x0;
        (pRVar4->super_BinSTree<int>).super_BinTree<int>.r = (BinTree<int> *)0x0;
        (pRVar4->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar7;
        pRVar4->c = true;
        *(RBTree<int> **)((long)&(pRVar7->super_BinSTree<int>).super_BinTree<int>.v + lVar10) =
             pRVar4;
        pRVar7 = (RBTree<int> *)(pRVar4->super_BinSTree<int>).super_BinTree<int>.p;
        if (pRVar7 == (RBTree<int> *)0x0) goto LAB_00102e8c;
        break;
      }
    }
    else {
      pRVar4 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.l;
      if (pRVar4 == (RBTree<int> *)0x0) {
        lVar10 = 8;
        goto LAB_00102cae;
      }
    }
    iVar2 = (pRVar4->super_BinSTree<int>).super_BinTree<int>.v;
    pRVar7 = pRVar4;
  } while( true );
  do {
    if (pRVar7->c != true) break;
    pRVar8 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.p;
    pRVar9 = (RBTree<int> *)(pRVar8->super_BinSTree<int>).super_BinTree<int>.l;
    if (pRVar7 == pRVar9) {
      pBVar3 = (pRVar8->super_BinSTree<int>).super_BinTree<int>.r;
      if ((pBVar3 != (BinTree<int> *)0x0) && ((char)pBVar3[1].v == '\x01')) {
        pRVar7->c = false;
        *(undefined1 *)&pBVar3[1].v = 0;
        goto LAB_00102d31;
      }
      pRVar5 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.r;
      if (pRVar4 == pRVar5) {
        pBVar3 = (pRVar5->super_BinSTree<int>).super_BinTree<int>.l;
        (pRVar7->super_BinSTree<int>).super_BinTree<int>.r = pBVar3;
        if (pBVar3 == (BinTree<int> *)0x0) {
          (pRVar5->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar8;
LAB_00102e10:
          (&(pRVar8->super_BinSTree<int>).super_BinTree<int>.l)
          [(RBTree<int> *)(pRVar8->super_BinSTree<int>).super_BinTree<int>.l != pRVar7] =
               (BinTree<int> *)pRVar5;
          pRVar6 = this;
        }
        else {
          pBVar3->p = (BinTree<int> *)pRVar7;
          pRVar8 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.p;
          (pRVar5->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar8;
          pRVar6 = pRVar5;
          if (pRVar8 != (RBTree<int> *)0x0) goto LAB_00102e10;
        }
        (pRVar5->super_BinSTree<int>).super_BinTree<int>.l = (BinTree<int> *)pRVar7;
        (pRVar7->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar5;
        pRVar8 = (RBTree<int> *)(pRVar5->super_BinSTree<int>).super_BinTree<int>.p;
        pRVar9 = (RBTree<int> *)(pRVar8->super_BinSTree<int>).super_BinTree<int>.l;
        pRVar4 = pRVar7;
        this = pRVar6;
        pRVar7 = pRVar5;
      }
      pRVar7->c = false;
      pRVar8->c = true;
      pBVar3 = (pRVar9->super_BinSTree<int>).super_BinTree<int>.r;
      (pRVar8->super_BinSTree<int>).super_BinTree<int>.l = pBVar3;
      if (pBVar3 != (BinTree<int> *)0x0) {
        pBVar3->p = (BinTree<int> *)pRVar8;
      }
      pBVar3 = (pRVar8->super_BinSTree<int>).super_BinTree<int>.p;
      (pRVar9->super_BinSTree<int>).super_BinTree<int>.p = pBVar3;
      pRVar7 = pRVar9;
      if (pBVar3 != (BinTree<int> *)0x0) {
        (&pBVar3->l)[(RBTree<int> *)pBVar3->r == pRVar8] = (BinTree<int> *)pRVar9;
        pRVar7 = this;
      }
      this = pRVar7;
      (pRVar9->super_BinSTree<int>).super_BinTree<int>.r = (BinTree<int> *)pRVar8;
      (pRVar8->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar9;
    }
    else if ((pRVar9 == (RBTree<int> *)0x0) || (pRVar9->c != true)) {
      pRVar9 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.l;
      if (pRVar4 == pRVar9) {
        pBVar3 = (pRVar9->super_BinSTree<int>).super_BinTree<int>.r;
        (pRVar7->super_BinSTree<int>).super_BinTree<int>.l = pBVar3;
        if (pBVar3 == (BinTree<int> *)0x0) {
          (pRVar9->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar8;
LAB_00102da2:
          (&(pRVar8->super_BinSTree<int>).super_BinTree<int>.l)
          [(RBTree<int> *)(pRVar8->super_BinSTree<int>).super_BinTree<int>.r == pRVar7] =
               (BinTree<int> *)pRVar9;
          pRVar5 = this;
        }
        else {
          pBVar3->p = (BinTree<int> *)pRVar7;
          pRVar8 = (RBTree<int> *)(pRVar7->super_BinSTree<int>).super_BinTree<int>.p;
          (pRVar9->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar8;
          pRVar5 = pRVar9;
          if (pRVar8 != (RBTree<int> *)0x0) goto LAB_00102da2;
        }
        (pRVar9->super_BinSTree<int>).super_BinTree<int>.r = (BinTree<int> *)pRVar7;
        (pRVar7->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar9;
        pRVar8 = (RBTree<int> *)(pRVar9->super_BinSTree<int>).super_BinTree<int>.p;
        pRVar4 = pRVar7;
        this = pRVar5;
        pRVar7 = pRVar9;
      }
      pRVar7->c = false;
      pRVar8->c = true;
      pRVar7 = (RBTree<int> *)(pRVar8->super_BinSTree<int>).super_BinTree<int>.r;
      pBVar3 = (pRVar7->super_BinSTree<int>).super_BinTree<int>.l;
      (pRVar8->super_BinSTree<int>).super_BinTree<int>.r = pBVar3;
      if (pBVar3 != (BinTree<int> *)0x0) {
        pBVar3->p = (BinTree<int> *)pRVar8;
      }
      pBVar3 = (pRVar8->super_BinSTree<int>).super_BinTree<int>.p;
      (pRVar7->super_BinSTree<int>).super_BinTree<int>.p = pBVar3;
      pRVar9 = pRVar7;
      if (pBVar3 != (BinTree<int> *)0x0) {
        (&pBVar3->l)[(RBTree<int> *)pBVar3->l != pRVar8] = (BinTree<int> *)pRVar7;
        pRVar9 = this;
      }
      this = pRVar9;
      (pRVar7->super_BinSTree<int>).super_BinTree<int>.l = (BinTree<int> *)pRVar8;
      (pRVar8->super_BinSTree<int>).super_BinTree<int>.p = (BinTree<int> *)pRVar7;
    }
    else {
      pRVar7->c = false;
      pRVar9->c = false;
LAB_00102d31:
      pRVar8->c = true;
      pRVar4 = pRVar8;
    }
    pRVar7 = (RBTree<int> *)(pRVar4->super_BinSTree<int>).super_BinTree<int>.p;
  } while (pRVar7 != (RBTree<int> *)0x0);
LAB_00102e8c:
  this->c = false;
  return this;
}

Assistant:

RBTree<T> *RBTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new RBTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<RBTree<T> *>(ip);
        RBTree<T> *y = nullptr;
        while (i->p() && i->p()->c) {
            if (i->p() == i->p()->p()->l()) {
                y = i->p()->p()->r();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->r()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->LR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->RR(i->p()->p()));
                }
            } else {
                y = i->p()->p()->l();
                if (y && y->c) {
                    i->p()->c = false;
                    y->c = false;
                    i->p()->p()->c = true;
                    i = i->p()->p();
                } else {
                    if (i == i->p()->l()) {
                        i = i->p();
                        root = static_cast<RBTree<T> *>(root->RR(i));
                    }
                    i->p()->c = false;
                    i->p()->p()->c = true;
                    root = static_cast<RBTree<T> *>(root->LR(i->p()->p()));
                }
            }
        }
        root->c = false;

        return root;
    }